

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ViewTest::scalarConstructorTest<true>(ViewTest *this)

{
  size_t sVar1;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  allocator_type local_49;
  View<int,_true,_std::allocator<unsigned_long>_> local_48;
  
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View(&local_48,&this->scalar_,&local_49);
  if (local_48.geometry_.size_ == 1) {
    sVar1 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&local_48);
    local_49 = (allocator_type)(sVar1 == 0);
  }
  else {
    local_49 = (allocator_type)0x0;
  }
  test((bool *)&local_49);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_48.geometry_);
  return;
}

Assistant:

void ViewTest::scalarConstructorTest() {
    andres::View<int, constTarget> v(&scalar_); 
    
    test(v.size() == 1 &&
           v.dimension() == 0);
}